

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

void Gia_FormStrTransform(char *pStr,char *pForm)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  
  uVar1 = 0;
  iVar3 = 0;
  do {
    cVar2 = pForm[iVar3];
    if (cVar2 == '~') {
      lVar4 = (long)iVar3;
      if (0x19 < (byte)(pForm[lVar4 + 1] + 0x9fU)) {
        __assert_fail("pForm[i] >= \'a\' && pForm[i] <= \'z\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                      ,0x25d,"void Gia_FormStrTransform(char *, char *)");
      }
      iVar3 = iVar3 + 1;
      cVar2 = pForm[lVar4 + 1] + -0x20;
    }
    else if (cVar2 == '\0') {
      pStr[uVar1 & 0xffffffff] = '\0';
      return;
    }
    pStr[uVar1] = cVar2;
    uVar1 = uVar1 + 1;
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void Gia_FormStrTransform( char * pStr, char * pForm )
{
    int i, k;
    for ( k = i = 0; pForm[i]; i++ )
    {
        if ( pForm[i] == '~' )
        {
            i++;
            assert( pForm[i] >= 'a' && pForm[i] <= 'z' );
            pStr[k++] = 'A' + pForm[i] - 'a';
        }
        else
            pStr[k++] = pForm[i];
    }
    pStr[k] = 0; 
}